

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.h
# Opt level: O1

void __thiscall
NativeFunction::NativeFunction<Sexp*,Sexp*>(NativeFunction *this,function<Sexp_*(Sexp_*)> *wrapped)

{
  function<Sexp_*(Sexp_**)> *this_00;
  _Any_data local_40;
  _Manager_type local_30;
  
  this->arity = 1;
  this_00 = (function<Sexp_*(Sexp_**)> *)operator_new(0x20);
  std::function<Sexp_*(Sexp_*)>::function((function<Sexp_*(Sexp_*)> *)&local_40,wrapped);
  std::function<Sexp*(Sexp**)>::
  function<NativeFunction::NativeFunction<Sexp*,Sexp*>(std::function<Sexp*(Sexp*)>)::_lambda(Sexp**)_1_,void>
            ((function<Sexp*(Sexp**)> *)this_00,(anon_class_32_1_e273b765 *)&local_40);
  this->func = this_00;
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

NativeFunction(std::function<Ret(Args...)> wrapped) {
    arity = sizeof...(Args);
    func = new std::function<Sexp *(Sexp **)>([=](Sexp **args) {
      return NativeFunctionHelper(wrapped, args,
                                  std::make_index_sequence<sizeof...(Args)>{});
    });
  }